

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O2

void Fxu_HeapDoubleSwap(Fxu_Double **pDiv1,Fxu_Double **pDiv2)

{
  int iVar1;
  Fxu_Double *pFVar2;
  
  pFVar2 = *pDiv1;
  *pDiv1 = *pDiv2;
  *pDiv2 = pFVar2;
  iVar1 = (*pDiv1)->HNum;
  (*pDiv1)->HNum = pFVar2->HNum;
  pFVar2->HNum = iVar1;
  return;
}

Assistant:

void Fxu_HeapDoubleSwap( Fxu_Double ** pDiv1, Fxu_Double ** pDiv2 )
{
    Fxu_Double * pDiv;
    int Temp;
    pDiv   = *pDiv1;
    *pDiv1 = *pDiv2;
    *pDiv2 = pDiv;
    Temp          = (*pDiv1)->HNum;
    (*pDiv1)->HNum = (*pDiv2)->HNum;
    (*pDiv2)->HNum = Temp;
}